

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

string * __thiscall
cs_impl::path_cs_ext::name_abi_cxx11_
          (string *__return_storage_ptr__,path_cs_ext *this,path_info *info)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)this,*(long *)(this + 8) + *(long *)this);
  return __return_storage_ptr__;
}

Assistant:

string name(const path_info &info)
		{
			return info.name;
		}